

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

int gzungetc(int c,gzFile file)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (((file == (gzFile)0x0) || (*file != 0x1c4f)) || (*(int *)((long)file + 0x6c) != 0)) {
    return -1;
  }
  if (*(int *)((long)file + 0x68) == 0) {
    if (c < 0) {
      return -1;
    }
  }
  else {
    *(undefined4 *)((long)file + 0x68) = 0;
    iVar2 = gz_skip((gz_statep)file,*(long *)((long)file + 0x60));
    if (c < 0) {
      return -1;
    }
    if (iVar2 == -1) {
      return -1;
    }
  }
  uVar3 = *(uint *)((long)file + 0x38);
  if ((ulong)uVar3 == 0) {
    *(undefined4 *)((long)file + 0x38) = 1;
    puVar4 = (undefined1 *)
             (*(long *)((long)file + 0x28) + (ulong)(uint)(*(int *)((long)file + 0x18) * 2) + -1);
    *(undefined1 **)((long)file + 0x30) = puVar4;
    *puVar4 = (char)c;
  }
  else {
    uVar1 = *(int *)((long)file + 0x18) * 2;
    if (uVar3 == uVar1) {
      gz_error((gz_statep)file,-5,"out of room to push characters");
      return -1;
    }
    uVar6 = *(ulong *)((long)file + 0x28);
    uVar7 = *(ulong *)((long)file + 0x30);
    if (uVar7 == uVar6) {
      uVar5 = uVar3 + uVar6;
      uVar6 = uVar1 + uVar6;
      while (uVar7 < uVar5) {
        puVar4 = (undefined1 *)(uVar5 - 1);
        uVar5 = uVar5 - 1;
        *(undefined1 *)(uVar6 - 1) = *puVar4;
        uVar6 = uVar6 - 1;
        uVar7 = *(ulong *)((long)file + 0x28);
      }
      uVar3 = *(uint *)((long)file + 0x38);
      uVar7 = uVar6;
    }
    *(uint *)((long)file + 0x38) = uVar3 + 1;
    *(ulong *)((long)file + 0x30) = uVar7 - 1;
    *(char *)(uVar7 - 1) = (char)c;
  }
  *(long *)((long)file + 0x10) = *(long *)((long)file + 0x10) + -1;
  return c;
}

Assistant:

int ZEXPORT gzungetc(int c, gzFile file)
{
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no error */
    if (state->mode != GZ_READ || state->err != Z_OK)
        return -1;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return -1;
    }

    /* can't push EOF */
    if (c < 0)
        return -1;

    /* if output buffer empty, put byte at end (allows more pushing) */
    if (state->have == 0) {
        state->have = 1;
        state->next = state->out + (state->size << 1) - 1;
        state->next[0] = c;
        state->pos--;
        return c;
    }

    /* if no room, give up (must have already done a gzungetc()) */
    if (state->have == (state->size << 1)) {
        gz_error(state, Z_BUF_ERROR, "out of room to push characters");
        return -1;
    }

    /* slide output data if needed and insert byte before existing data */
    if (state->next == state->out) {
        unsigned char *src = state->out + state->have;
        unsigned char *dest = state->out + (state->size << 1);
        while (src > state->out)
            *--dest = *--src;
        state->next = dest;
    }
    state->have++;
    state->next--;
    state->next[0] = c;
    state->pos--;
    return c;
}